

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O2

void Vec_BitFill(Vec_Bit_t *p,int nSize,int Fill)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __size;
  uint uVar4;
  int iVar5;
  
  if (p->nCap < nSize) {
    iVar5 = ((nSize >> 5) + 1) - (uint)((nSize & 0x1fU) == 0);
    __size = (long)iVar5 << 2;
    if (p->pArray == (int *)0x0) {
      piVar1 = (int *)malloc(__size);
    }
    else {
      piVar1 = (int *)realloc(p->pArray,__size);
    }
    p->pArray = piVar1;
    if (piVar1 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    p->nCap = iVar5 * 0x20;
  }
  uVar4 = ((nSize >> 5) + 1) - (uint)((nSize & 0x1fU) == 0);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar3 = (ulong)uVar4;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    p->pArray[uVar2] = 0;
  }
  p->nSize = uVar4 * 0x20;
  return;
}

Assistant:

static inline void Vec_BitFill( Vec_Bit_t * p, int nSize, int Fill )
{
    int i;
    Vec_BitGrow( p, nSize );
    nSize = (nSize >> 5) + ((nSize & 31) > 0);
    if ( Fill == 0 )
    {
        for ( i = 0; i < nSize; i++ )
            p->pArray[i] = 0;
    }
    else if ( Fill == 1 )
    {
        for ( i = 0; i < nSize; i++ )
            p->pArray[i] = ~0;
    }
    else assert( 0 );
    p->nSize = nSize * 32;
}